

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O0

bool google::protobuf::util::SerializeDelimitedToZeroCopyStream
               (MessageLite *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  undefined1 local_68 [8];
  CodedOutputStream coded_output;
  ZeroCopyOutputStream *output_local;
  MessageLite *message_local;
  
  coded_output.start_count_ = (int64_t)output;
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ZeroCopyOutputStream,void>
            ((CodedOutputStream *)local_68,output);
  bVar1 = SerializeDelimitedToCodedStream(message,(CodedOutputStream *)local_68);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_68);
  return bVar1;
}

Assistant:

bool SerializeDelimitedToZeroCopyStream(const MessageLite& message,
                                        io::ZeroCopyOutputStream* output) {
  io::CodedOutputStream coded_output(output);
  return SerializeDelimitedToCodedStream(message, &coded_output);
}